

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathObjectPtr xmlXPathCacheObjectCopy(xmlXPathContextPtr ctxt,xmlXPathObjectPtr val)

{
  xmlNodeSetPtr val_00;
  xmlXPathObjectPtr pxVar1;
  
  if (val != (xmlXPathObjectPtr)0x0) {
    if ((ctxt != (xmlXPathContextPtr)0x0) && (ctxt->cache != (void *)0x0)) {
      switch(val->type) {
      case XPATH_NODESET:
        val_00 = xmlXPathNodeSetMerge((xmlNodeSetPtr)0x0,val->nodesetval);
        pxVar1 = xmlXPathCacheWrapNodeSet(ctxt,val_00);
        return pxVar1;
      case XPATH_BOOLEAN:
        pxVar1 = xmlXPathCacheNewBoolean(ctxt,val->boolval);
        return pxVar1;
      case XPATH_NUMBER:
        pxVar1 = xmlXPathCacheNewFloat(ctxt,val->floatval);
        return pxVar1;
      case XPATH_STRING:
        pxVar1 = xmlXPathCacheNewString(ctxt,val->stringval);
        return pxVar1;
      }
    }
    pxVar1 = xmlXPathObjectCopy(val);
    return pxVar1;
  }
  return (xmlXPathObjectPtr)0x0;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheObjectCopy(xmlXPathContextPtr ctxt, xmlXPathObjectPtr val)
{
    if (val == NULL)
	return(NULL);

    if (XP_HAS_CACHE(ctxt)) {
	switch (val->type) {
	    case XPATH_NODESET:
		return(xmlXPathCacheWrapNodeSet(ctxt,
		    xmlXPathNodeSetMerge(NULL, val->nodesetval)));
	    case XPATH_STRING:
		return(xmlXPathCacheNewString(ctxt, val->stringval));
	    case XPATH_BOOLEAN:
		return(xmlXPathCacheNewBoolean(ctxt, val->boolval));
	    case XPATH_NUMBER:
		return(xmlXPathCacheNewFloat(ctxt, val->floatval));
	    default:
		break;
	}
    }
    return(xmlXPathObjectCopy(val));
}